

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O0

int jpc_mqenc_flush(jpc_mqenc_t *mqenc,int termmode)

{
  int_fast16_t iVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  long local_20;
  int_fast16_t k;
  int termmode_local;
  jpc_mqenc_t *mqenc_local;
  
  if (termmode == 0) {
    jpc_mqenc_setbits(mqenc);
    mqenc->creg = mqenc->creg << ((byte)mqenc->ctreg & 0x3f);
    if (mqenc->outbuf == 0xff) {
      if (-1 < mqenc->outbuf) {
        if ((mqenc->out->flags_ & 7U) == 0) {
          if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
            mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
            iVar3 = mqenc->out->cnt_ + -1;
            mqenc->out->cnt_ = iVar3;
            if (iVar3 < 0) {
              local_b0 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
            }
            else {
              mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
              iVar1 = mqenc->outbuf;
              puVar2 = mqenc->out->ptr_;
              mqenc->out->ptr_ = puVar2 + 1;
              *puVar2 = (uchar)iVar1;
              local_b0 = (uint)iVar1 & 0xff;
            }
            local_ac = local_b0;
          }
          else {
            mqenc->out->flags_ = mqenc->out->flags_ | 4;
            local_ac = 0xffffffff;
          }
          local_b4 = local_ac;
        }
        else {
          local_b4 = 0xffffffff;
        }
        if (local_b4 == 0xffffffff) {
          mqenc->err = mqenc->err | 1;
        }
      }
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
      mqenc->creg = mqenc->creg & 0xfffff;
      mqenc->ctreg = 7;
    }
    else if ((mqenc->creg & 0x8000000) == 0) {
      if (-1 < mqenc->outbuf) {
        if ((mqenc->out->flags_ & 7U) == 0) {
          if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
            mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
            iVar3 = mqenc->out->cnt_ + -1;
            mqenc->out->cnt_ = iVar3;
            if (iVar3 < 0) {
              local_a4 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
            }
            else {
              mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
              iVar1 = mqenc->outbuf;
              puVar2 = mqenc->out->ptr_;
              mqenc->out->ptr_ = puVar2 + 1;
              *puVar2 = (uchar)iVar1;
              local_a4 = (uint)iVar1 & 0xff;
            }
            local_a0 = local_a4;
          }
          else {
            mqenc->out->flags_ = mqenc->out->flags_ | 4;
            local_a0 = 0xffffffff;
          }
          local_a8 = local_a0;
        }
        else {
          local_a8 = 0xffffffff;
        }
        if (local_a8 == 0xffffffff) {
          mqenc->err = mqenc->err | 1;
        }
      }
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
      mqenc->creg = mqenc->creg & 0x7ffff;
      mqenc->ctreg = 8;
    }
    else {
      lVar4 = mqenc->outbuf + 1;
      mqenc->outbuf = lVar4;
      if (lVar4 == 0xff) {
        mqenc->creg = mqenc->creg & 0x7ffffff;
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_8c = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_8c = (uint)iVar1 & 0xff;
              }
              local_88 = local_8c;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_88 = 0xffffffff;
            }
            local_90 = local_88;
          }
          else {
            local_90 = 0xffffffff;
          }
          if (local_90 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = mqenc->creg & 0xfffff;
        mqenc->ctreg = 7;
      }
      else {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_98 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_98 = (uint)iVar1 & 0xff;
              }
              local_94 = local_98;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_94 = 0xffffffff;
            }
            local_9c = local_94;
          }
          else {
            local_9c = 0xffffffff;
          }
          if (local_9c == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
        mqenc->creg = mqenc->creg & 0x7ffff;
        mqenc->ctreg = 8;
      }
    }
    mqenc->creg = mqenc->creg << ((byte)mqenc->ctreg & 0x3f);
    if (mqenc->outbuf == 0xff) {
      if (-1 < mqenc->outbuf) {
        if ((mqenc->out->flags_ & 7U) == 0) {
          if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
            mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
            iVar3 = mqenc->out->cnt_ + -1;
            mqenc->out->cnt_ = iVar3;
            if (iVar3 < 0) {
              local_e0 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
            }
            else {
              mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
              iVar1 = mqenc->outbuf;
              puVar2 = mqenc->out->ptr_;
              mqenc->out->ptr_ = puVar2 + 1;
              *puVar2 = (uchar)iVar1;
              local_e0 = (uint)iVar1 & 0xff;
            }
            local_dc = local_e0;
          }
          else {
            mqenc->out->flags_ = mqenc->out->flags_ | 4;
            local_dc = 0xffffffff;
          }
          local_e4 = local_dc;
        }
        else {
          local_e4 = 0xffffffff;
        }
        if (local_e4 == 0xffffffff) {
          mqenc->err = mqenc->err | 1;
        }
      }
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
      mqenc->creg = mqenc->creg & 0xfffff;
      mqenc->ctreg = 7;
    }
    else if ((mqenc->creg & 0x8000000) == 0) {
      if (-1 < mqenc->outbuf) {
        if ((mqenc->out->flags_ & 7U) == 0) {
          if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
            mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
            iVar3 = mqenc->out->cnt_ + -1;
            mqenc->out->cnt_ = iVar3;
            if (iVar3 < 0) {
              local_d4 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
            }
            else {
              mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
              iVar1 = mqenc->outbuf;
              puVar2 = mqenc->out->ptr_;
              mqenc->out->ptr_ = puVar2 + 1;
              *puVar2 = (uchar)iVar1;
              local_d4 = (uint)iVar1 & 0xff;
            }
            local_d0 = local_d4;
          }
          else {
            mqenc->out->flags_ = mqenc->out->flags_ | 4;
            local_d0 = 0xffffffff;
          }
          local_d8 = local_d0;
        }
        else {
          local_d8 = 0xffffffff;
        }
        if (local_d8 == 0xffffffff) {
          mqenc->err = mqenc->err | 1;
        }
      }
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
      mqenc->creg = mqenc->creg & 0x7ffff;
      mqenc->ctreg = 8;
    }
    else {
      lVar4 = mqenc->outbuf + 1;
      mqenc->outbuf = lVar4;
      if (lVar4 == 0xff) {
        mqenc->creg = mqenc->creg & 0x7ffffff;
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_bc = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_bc = (uint)iVar1 & 0xff;
              }
              local_b8 = local_bc;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_b8 = 0xffffffff;
            }
            local_c0 = local_b8;
          }
          else {
            local_c0 = 0xffffffff;
          }
          if (local_c0 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = mqenc->creg & 0xfffff;
        mqenc->ctreg = 7;
      }
      else {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_c8 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_c8 = (uint)iVar1 & 0xff;
              }
              local_c4 = local_c8;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_c4 = 0xffffffff;
            }
            local_cc = local_c4;
          }
          else {
            local_cc = 0xffffffff;
          }
          if (local_cc == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
        mqenc->creg = mqenc->creg & 0x7ffff;
        mqenc->ctreg = 8;
      }
    }
    if (mqenc->outbuf != 0xff) {
      if (mqenc->outbuf == 0xff) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_110 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_110 = (uint)iVar1 & 0xff;
              }
              local_10c = local_110;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_10c = 0xffffffff;
            }
            local_114 = local_10c;
          }
          else {
            local_114 = 0xffffffff;
          }
          if (local_114 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = mqenc->creg & 0xfffff;
        mqenc->ctreg = 7;
      }
      else if ((mqenc->creg & 0x8000000) == 0) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_104 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_104 = (uint)iVar1 & 0xff;
              }
              local_100 = local_104;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_100 = 0xffffffff;
            }
            local_108 = local_100;
          }
          else {
            local_108 = 0xffffffff;
          }
          if (local_108 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
        mqenc->creg = mqenc->creg & 0x7ffff;
        mqenc->ctreg = 8;
      }
      else {
        lVar4 = mqenc->outbuf + 1;
        mqenc->outbuf = lVar4;
        if (lVar4 == 0xff) {
          mqenc->creg = mqenc->creg & 0x7ffffff;
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_ec = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_ec = (uint)iVar1 & 0xff;
                }
                local_e8 = local_ec;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_e8 = 0xffffffff;
              }
              local_f0 = local_e8;
            }
            else {
              local_f0 = 0xffffffff;
            }
            if (local_f0 == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
          mqenc->creg = mqenc->creg & 0xfffff;
          mqenc->ctreg = 7;
        }
        else {
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_f8 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_f8 = (uint)iVar1 & 0xff;
                }
                local_f4 = local_f8;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_f4 = 0xffffffff;
              }
              local_fc = local_f4;
            }
            else {
              local_fc = 0xffffffff;
            }
            if (local_fc == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
          mqenc->creg = mqenc->creg & 0x7ffff;
          mqenc->ctreg = 8;
        }
      }
    }
  }
  else {
    if (termmode != 1) {
      abort();
    }
    for (local_20 = 0xc - mqenc->ctreg; 0 < local_20; local_20 = local_20 - mqenc->ctreg) {
      mqenc->creg = mqenc->creg << ((byte)mqenc->ctreg & 0x3f);
      mqenc->ctreg = 0;
      if (mqenc->outbuf == 0xff) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_50 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_50 = (uint)iVar1 & 0xff;
              }
              local_4c = local_50;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_4c = 0xffffffff;
            }
            local_54 = local_4c;
          }
          else {
            local_54 = 0xffffffff;
          }
          if (local_54 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = mqenc->creg & 0xfffff;
        mqenc->ctreg = 7;
      }
      else if ((mqenc->creg & 0x8000000) == 0) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_44 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_44 = (uint)iVar1 & 0xff;
              }
              local_40 = local_44;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_40 = 0xffffffff;
            }
            local_48 = local_40;
          }
          else {
            local_48 = 0xffffffff;
          }
          if (local_48 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
        mqenc->creg = mqenc->creg & 0x7ffff;
        mqenc->ctreg = 8;
      }
      else {
        lVar4 = mqenc->outbuf + 1;
        mqenc->outbuf = lVar4;
        if (lVar4 == 0xff) {
          mqenc->creg = mqenc->creg & 0x7ffffff;
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_2c = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_2c = (uint)iVar1 & 0xff;
                }
                local_28 = local_2c;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_28 = 0xffffffff;
              }
              local_30 = local_28;
            }
            else {
              local_30 = 0xffffffff;
            }
            if (local_30 == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
          mqenc->creg = mqenc->creg & 0xfffff;
          mqenc->ctreg = 7;
        }
        else {
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_38 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_38 = (uint)iVar1 & 0xff;
                }
                local_34 = local_38;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_34 = 0xffffffff;
              }
              local_3c = local_34;
            }
            else {
              local_3c = 0xffffffff;
            }
            if (local_3c == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
          mqenc->creg = mqenc->creg & 0x7ffff;
          mqenc->ctreg = 8;
        }
      }
    }
    if (mqenc->outbuf != 0xff) {
      if (mqenc->outbuf == 0xff) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_80 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_80 = (uint)iVar1 & 0xff;
              }
              local_7c = local_80;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_7c = 0xffffffff;
            }
            local_84 = local_7c;
          }
          else {
            local_84 = 0xffffffff;
          }
          if (local_84 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = mqenc->creg & 0xfffff;
        mqenc->ctreg = 7;
      }
      else if ((mqenc->creg & 0x8000000) == 0) {
        if (-1 < mqenc->outbuf) {
          if ((mqenc->out->flags_ & 7U) == 0) {
            if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
              mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
              iVar3 = mqenc->out->cnt_ + -1;
              mqenc->out->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_74 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
              }
              else {
                mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                iVar1 = mqenc->outbuf;
                puVar2 = mqenc->out->ptr_;
                mqenc->out->ptr_ = puVar2 + 1;
                *puVar2 = (uchar)iVar1;
                local_74 = (uint)iVar1 & 0xff;
              }
              local_70 = local_74;
            }
            else {
              mqenc->out->flags_ = mqenc->out->flags_ | 4;
              local_70 = 0xffffffff;
            }
            local_78 = local_70;
          }
          else {
            local_78 = 0xffffffff;
          }
          if (local_78 == 0xffffffff) {
            mqenc->err = mqenc->err | 1;
          }
        }
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
        mqenc->creg = mqenc->creg & 0x7ffff;
        mqenc->ctreg = 8;
      }
      else {
        lVar4 = mqenc->outbuf + 1;
        mqenc->outbuf = lVar4;
        if (lVar4 == 0xff) {
          mqenc->creg = mqenc->creg & 0x7ffffff;
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_5c = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_5c = (uint)iVar1 & 0xff;
                }
                local_58 = local_5c;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_58 = 0xffffffff;
              }
              local_60 = local_58;
            }
            else {
              local_60 = 0xffffffff;
            }
            if (local_60 == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
          mqenc->creg = mqenc->creg & 0xfffff;
          mqenc->ctreg = 7;
        }
        else {
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar3 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar3;
                if (iVar3 < 0) {
                  local_68 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar1 = mqenc->outbuf;
                  puVar2 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar2 + 1;
                  *puVar2 = (uchar)iVar1;
                  local_68 = (uint)iVar1 & 0xff;
                }
                local_64 = local_68;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_64 = 0xffffffff;
              }
              local_6c = local_64;
            }
            else {
              local_6c = 0xffffffff;
            }
            if (local_6c == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
          mqenc->creg = mqenc->creg & 0x7ffff;
          mqenc->ctreg = 8;
        }
      }
    }
  }
  return 0;
}

Assistant:

int jpc_mqenc_flush(jpc_mqenc_t *mqenc, int termmode)
{
	int_fast16_t k;

	switch (termmode) {
	case JPC_MQENC_PTERM:
		k = 11 - mqenc->ctreg + 1;
		while (k > 0) {
			mqenc->creg <<= mqenc->ctreg;
			mqenc->ctreg = 0;
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg,
			  mqenc);
			k -= mqenc->ctreg;
		}
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	case JPC_MQENC_DEFTERM:
		jpc_mqenc_setbits(mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	default:
		abort();
		break;
	}
	return 0;
}